

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.h
# Opt level: O1

StateFactorDiscrete * __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetStateFactorDiscrete
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sfacI)

{
  pointer ppSVar1;
  
  ppSVar1 = (this->_m_S)._m_stateFactors.
            super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)sfacI <
      (ulong)((long)(this->_m_S)._m_stateFactors.
                    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3)) {
    return ppSVar1[sfacI];
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const StateFactorDiscrete* GetStateFactorDiscrete(Index sfacI) const
        { return _m_stateFactors.at(sfacI); }